

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

string * CreateFlatBufferTest_abi_cxx11_(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Offset<flatbuffers::String> off;
  Offset<flatbuffers::Vector<unsigned_char>_> off_00;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*>_> off_01;
  Offset<void> off_02;
  Offset<MyGame::Example::Monster> root;
  string *in_RDI;
  uoffset_t start;
  FlatBufferBuilder builder;
  Test tests [2];
  uchar inv_data [10];
  FlatBufferBuilder local_d0;
  string *local_70;
  Vec3 local_68;
  undefined8 local_48;
  uchar local_40 [16];
  
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder(&local_d0,0x400);
  local_68.x_ = 1.0;
  local_68.y_ = 2.0;
  local_68.z_ = 3.0;
  local_68._12_6_ = 0;
  local_68.test1_._2_2_ = 0;
  local_68._20_6_ = 0;
  local_68.test3_.a_ = 10;
  local_68.test3_.b_ = '\x14';
  local_68.test3_.__padding0 = '\0';
  local_68.__padding2 = 0;
  off = flatbuffers::FlatBufferBuilder::CreateString(&local_d0,"MyMonster",9);
  local_40[0] = '\0';
  local_40[1] = '\x01';
  local_40[2] = '\x02';
  local_40[3] = '\x03';
  local_40[4] = '\x04';
  local_40[5] = '\x05';
  local_40[6] = '\x06';
  local_40[7] = '\a';
  local_40[8] = '\b';
  local_40[9] = '\t';
  local_70 = in_RDI;
  off_00 = flatbuffers::FlatBufferBuilder::CreateVector<unsigned_char>(&local_d0,local_40,10);
  local_48 = 0x28001e0014000a;
  off_01 = flatbuffers::FlatBufferBuilder::CreateVectorOfStructs<MyGame::Example::Test>
                     (&local_d0,(Test *)&local_48,2);
  iVar3 = (int)local_d0.buf_.cur_;
  iVar2 = (int)local_d0.buf_.buf_;
  iVar1 = (int)local_d0.buf_.reserved_;
  if (local_d0.offsetbuf_.
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_d0.offsetbuf_.
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    flatbuffers::FlatBufferBuilder::AddElement<short>(&local_d0,8,0x14,100);
    off_02.o = flatbuffers::FlatBufferBuilder::EndTable(&local_d0,iVar2 + (iVar1 - iVar3),10);
    if (local_d0.offsetbuf_.
        super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_d0.offsetbuf_.
        super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      start = ((int)local_d0.buf_.reserved_ - (int)local_d0.buf_.cur_) + (int)local_d0.buf_.buf_;
      flatbuffers::FlatBufferBuilder::AddOffset<flatbuffers::Vector<MyGame::Example::Test_const*>>
                (&local_d0,0x16,off_01);
      flatbuffers::FlatBufferBuilder::AddOffset<void>(&local_d0,0x14,off_02);
      flatbuffers::FlatBufferBuilder::AddOffset<flatbuffers::Vector<unsigned_char>>
                (&local_d0,0xe,off_00);
      flatbuffers::FlatBufferBuilder::AddOffset<flatbuffers::String>(&local_d0,10,off);
      flatbuffers::FlatBufferBuilder::AddStruct<MyGame::Example::Vec3>(&local_d0,4,&local_68);
      flatbuffers::FlatBufferBuilder::AddElement<short>(&local_d0,8,0x50,100);
      flatbuffers::FlatBufferBuilder::AddElement<short>(&local_d0,6,0x96,0x96);
      flatbuffers::FlatBufferBuilder::AddElement<unsigned_char>(&local_d0,0x12,'\x01','\0');
      flatbuffers::FlatBufferBuilder::AddElement<signed_char>(&local_d0,0x10,'\x02','\x02');
      root.o = flatbuffers::FlatBufferBuilder::EndTable(&local_d0,start,10);
      flatbuffers::FlatBufferBuilder::Finish<MyGame::Example::Monster>(&local_d0,root);
      (local_70->_M_dataplus)._M_p = (pointer)&local_70->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,CONCAT44(local_d0.buf_.cur_._4_4_,(int)local_d0.buf_.cur_),
                 (ulong)(uint)(((int)local_d0.buf_.reserved_ - (int)local_d0.buf_.cur_) +
                              (int)local_d0.buf_.buf_) +
                 CONCAT44(local_d0.buf_.cur_._4_4_,(int)local_d0.buf_.cur_));
      if (local_d0.vtables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.vtables_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_d0.offsetbuf_.
          super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.offsetbuf_.
                        super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT44(local_d0.buf_.buf_._4_4_,(int)local_d0.buf_.buf_) != (void *)0x0) {
        operator_delete__((void *)CONCAT44(local_d0.buf_.buf_._4_4_,(int)local_d0.buf_.buf_));
      }
      return local_70;
    }
  }
  __assert_fail("!offsetbuf_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                ,0x183,"void flatbuffers::FlatBufferBuilder::NotNested()");
}

Assistant:

std::string CreateFlatBufferTest() {
  flatbuffers::FlatBufferBuilder builder;

  auto vec = Vec3(1, 2, 3, 0, 0, Test(10, 20));

  auto name = builder.CreateString("MyMonster");

  unsigned char inv_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9 };
  auto inventory = builder.CreateVector(inv_data, 10);

  Test tests[] = { Test(10, 20), Test(30, 40) };
  auto testv = builder.CreateVectorOfStructs(tests, 2);

  // create monster with very few fields set:
  // (same functionality as CreateMonster below, but sets fields manually)
  MonsterBuilder mb(builder);
  mb.add_hp(20);
  auto mloc2 = mb.Finish();

  // shortcut for creating monster with all fields set:
  auto mloc = CreateMonster(builder, &vec, 150, 80, name, inventory, Color_Blue,
                            Any_Monster, mloc2.Union(), // Store a union.
                            testv);

  builder.Finish(mloc);

  #ifdef FLATBUFFERS_TEST_VERBOSE
  // print byte data for debugging:
  auto p = builder.GetBufferPointer();
  for (flatbuffers::uoffset_t i = 0; i < builder.GetSize(); i++)
    printf("%d ", p[i]);
  #endif

  // return the buffer for the caller to use.
  return std::string(reinterpret_cast<const char *>(builder.GetBufferPointer()),
                     builder.GetSize());
}